

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

String * __thiscall
kj::_::Debug::makeDescription<char_const(&)[17]>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,char (*params) [17])

{
  char *pcVar1;
  size_t sVar2;
  size_t in_R8;
  ArrayPtr<kj::String> argValues_00;
  String argValues [1];
  String local_38;
  
  str<char_const(&)[17]>(&local_38,(kj *)macroArgs,(char (*) [17])macroArgs);
  argValues_00.size_ = in_R8;
  argValues_00.ptr = (String *)0x1;
  makeDescriptionInternal(__return_storage_ptr__,this,(char *)&local_38,argValues_00);
  sVar2 = local_38.content.size_;
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}